

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall duckdb_re2::Regexp::~Regexp(Regexp *this)

{
  uint8_t uVar1;
  string *this_00;
  ostringstream local_188 [376];
  
  if (this->nsub_ != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Regexp not destroyed.");
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  uVar1 = this->op_;
  if (uVar1 == '\x04') {
    if ((this->arguments).the_union_[1] != (void *)0x0) {
      operator_delete__((this->arguments).the_union_[1]);
    }
  }
  else {
    if (uVar1 == '\x14') {
      if ((this->arguments).the_union_[0] != (void *)0x0) {
        operator_delete__((this->arguments).the_union_[0]);
      }
      this_00 = (string *)(this->arguments).the_union_[1];
      if (this_00 != (string *)0x0) {
        std::
        _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
        ::~_Rb_tree((_Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                     *)&this_00->field_2);
      }
    }
    else {
      if (uVar1 != '\v') {
        return;
      }
      this_00 = (this->arguments).capture.name_;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete arguments.capture.name_;
      break;
    case kRegexpLiteralString:
      delete[] arguments.literal_string.runes_;
      break;
    case kRegexpCharClass:
      if (arguments.char_class.cc_)
		  arguments.char_class.cc_->Delete();
      delete arguments.char_class.ccb_;
      break;
  }
}